

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmListFileBacktrace __thiscall cmMakefile::GetBacktrace(cmMakefile *this,cmCommandContext *cc)

{
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  cmListFileBacktrace cVar2;
  cmListFileContext lfc;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 local_50;
  string local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_88 = 0;
  local_80 = 0;
  local_68 = 0;
  local_60 = 0;
  local_50 = 0;
  local_90 = &local_80;
  local_70 = &local_60;
  std::__cxx11::string::_M_assign((string *)&local_90);
  local_50 = *(undefined8 *)(in_RDX + 0x40);
  cmStateSnapshot::GetExecutionListFile_abi_cxx11_(&local_48,(cmStateSnapshot *)(cc + 10));
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  cVar2 = cmListFileBacktrace::Push
                    ((cmListFileBacktrace *)this,
                     (cmListFileContext *)((long)&cc[10].Name.Lower.field_2 + 8));
  _Var1._M_pi = cVar2.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    _Var1._M_pi = extraout_RDX_00;
  }
  cVar2.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  cVar2.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar2.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace(cmCommandContext const& cc) const
{
  cmListFileContext lfc;
  lfc.Name = cc.Name.Original;
  lfc.Line = cc.Line;
  lfc.FilePath = this->StateSnapshot.GetExecutionListFile();
  return this->Backtrace.Push(lfc);
}